

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_70a26::Pedestrian::reset(Pedestrian *this)

{
  PolylineSegmentedPathwaySingleRadius *pPVar1;
  long *in_RDI;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Vec3 VVar5;
  SimpleVehicle *in_stack_00000010;
  Vec3 randomOffset;
  float r;
  float d;
  Vec3 *in_stack_ffffffffffffff18;
  long *plVar6;
  Vec3 *in_stack_ffffffffffffff20;
  undefined8 local_cc;
  undefined4 local_c4;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float in_stack_ffffffffffffff5c;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this_00;
  SimpleVehicle *in_stack_ffffffffffffff70;
  float local_88;
  
  OpenSteer::SimpleVehicle::reset(in_stack_ffffffffffffff70);
  (**(code **)(*in_RDI + 0x108))(0x40000000);
  (**(code **)(*in_RDI + 0xf8))(0x41000000);
  (**(code **)(*in_RDI + 0xe0))(0);
  (**(code **)(*in_RDI + 200))(0x3f000000);
  pPVar1 = getTestPath();
  in_RDI[0x1e] = (long)pPVar1;
  fVar2 = (float)(**(code **)(*(long *)in_RDI[0x1e] + 0x38))();
  fVar3 = OpenSteer::frandom01();
  OpenSteer::PolylineSegmentedPathwaySingleRadius::radius
            ((PolylineSegmentedPathwaySingleRadius *)in_RDI[0x1e]);
  OpenSteer::randomVectorOnUnitRadiusXZDisk();
  OpenSteer::Vec3::operator*
            (in_stack_ffffffffffffff20,(float)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  (**(code **)(*(long *)in_RDI[0x1e] + 0x20))(fVar2 * fVar3);
  VVar5 = OpenSteer::Vec3::operator+(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_88 = VVar5.z;
  this_00 = VVar5._0_8_;
  local_b8 = local_88;
  local_c0 = (**(code **)(*in_RDI + 0x48))(this_00);
  local_b0 = local_c0;
  fVar2 = local_b8;
  OpenSteer::SimpleVehicle::randomizeHeadingOnXZPlane(in_stack_00000010);
  fVar3 = OpenSteer::frandom01();
  uVar4 = 0;
  *(uint *)(in_RDI + 0x1f) = ((fVar3 <= 0.5) - 1) + (uint)(fVar3 <= 0.5);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters(this_00,in_stack_ffffffffffffff5c,(int)fVar2);
  plVar6 = (long *)in_RDI[0x1d];
  local_cc = (**(code **)(*in_RDI + 0x40))();
  local_c4 = uVar4;
  (**(code **)(*plVar6 + 0x10))(plVar6,&local_cc);
  return;
}

Assistant:

void reset (void)
        {
            // reset the vehicle 
            SimpleVehicle::reset ();
            
            // max speed and max steering force (maneuverability) 
            setMaxSpeed (2.0);
            setMaxForce (8.0);
            
            // initially stopped
            setSpeed (0);
            
            // size of bounding sphere, for obstacle avoidance, etc.
            setRadius (0.5); // width = 0.7, add 0.3 margin, take half
            
            // set the path for this Pedestrian to follow
            path = getTestPath ();
            
            // set initial position
            // (random point on path + random horizontal offset)
            const float d = path->length() * frandom01();
            const float r = path->radius();
            const Vec3 randomOffset = randomVectorOnUnitRadiusXZDisk () * r;
            setPosition (path->mapPathDistanceToPoint (d) + randomOffset);
            
            // randomize 2D heading
            randomizeHeadingOnXZPlane ();
            
            // pick a random direction for path following (upstream or downstream)
            pathDirection = (frandom01() > 0.5) ? -1 : +1;
            
            // trail parameters: 3 seconds with 60 points along the trail
            setTrailParameters (3, 60);
            
            // notify proximity database that our position has changed
            proximityToken->updateForNewPosition (position());
        }